

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderOperatorTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::eval_dot_vec2(ShaderEvalContext *c)

{
  undefined8 uVar1;
  float fVar2;
  Vector<float,_2> local_18;
  Vector<float,_2> local_10;
  
  local_10.m_data[1] = c->in[0].m_data[1];
  local_10.m_data[0] = c->in[0].m_data[3];
  uVar1 = *(undefined8 *)c->in[1].m_data;
  local_18.m_data[1] = (float)uVar1;
  local_18.m_data[0] = (float)((ulong)uVar1 >> 0x20);
  fVar2 = tcu::dot<float,2>(&local_10,&local_18);
  (c->color).m_data[0] = fVar2;
  return;
}

Assistant:

void eval_cross_vec3 (ShaderEvalContext& c) { c.color.xyz()	= cross(c.in[0].swizzle(2, 0, 1), c.in[1].swizzle(1, 2, 0)); }